

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int32_t zng_deflateResetKeep(zng_stream *strm)

{
  deflate_state *s;
  int iVar1;
  uint32_t uVar2;
  int32_t iVar3;
  
  iVar1 = deflateStateCheck(strm);
  if (iVar1 == 0) {
    strm->total_in = 0;
    strm->total_out = 0;
    strm->msg = (char *)0x0;
    strm->data_type = 2;
    s = strm->state;
    s->pending = 0;
    s->pending_out = s->pending_buf;
    iVar1 = s->wrap;
    if (iVar1 < 0) {
      iVar1 = -iVar1;
      s->wrap = iVar1;
    }
    s->status = (uint)(iVar1 == 2) * 3 + 1;
    if (iVar1 == 2) {
      uVar2 = (*functable.crc32_fold_reset)(&s->crc_fold);
    }
    else {
      uVar2 = 1;
    }
    strm->adler = uVar2;
    s->last_flush = -2;
    zng_tr_init(s);
    iVar3 = 0;
  }
  else {
    iVar3 = -2;
  }
  return iVar3;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateResetKeep)(PREFIX3(stream) *strm) {
    deflate_state *s;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;

    strm->total_in = strm->total_out = 0;
    strm->msg = NULL; /* use zfree if we ever allocate msg dynamically */
    strm->data_type = Z_UNKNOWN;

    s = (deflate_state *)strm->state;
    s->pending = 0;
    s->pending_out = s->pending_buf;

    if (s->wrap < 0)
        s->wrap = -s->wrap; /* was made negative by deflate(..., Z_FINISH); */

    s->status =
#ifdef GZIP
        s->wrap == 2 ? GZIP_STATE :
#endif
        INIT_STATE;

#ifdef GZIP
    if (s->wrap == 2) {
        strm->adler = FUNCTABLE_CALL(crc32_fold_reset)(&s->crc_fold);
    } else
#endif
        strm->adler = ADLER32_INITIAL_VALUE;
    s->last_flush = -2;

    zng_tr_init(s);

    DEFLATE_RESET_KEEP_HOOK(strm);  /* hook for IBM Z DFLTCC */

    return Z_OK;
}